

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O2

void __thiscall SSD1306::OledBitmap<128,_64>::setPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  uchar *puVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar3) {
    lVar2 = (long)((ulong)(uint)(p.m_x >> 0x1f) << 0x20 | (ulong)p & 0xffffffff) / 8;
    puVar1 = (this->blocks_)._M_elems[(long)p >> 0x20]._M_elems + (int)lVar2;
    *puVar1 = *puVar1 | (byte)(1 << (7U - ((char)p.m_x + (char)lVar2 * -8) & 0x1f));
  }
  return;
}

Assistant:

void
    setPixel(
        SSD1306::OledPoint p) override
    {
        if (not pixelInside(p))
        {
            return;
        }

        PixelOffset offset{p};

        blocks_[offset.block][offset.byte] |= (1 << offset.bit);
    }